

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::internal::RepeatedFieldAccessor::Get<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,RepeatedFieldAccessor *this,Field *data,int index)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  ActualType scratch_space;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  local_28 = 0;
  local_20[0] = 0;
  local_30 = local_20;
  iVar2 = (*this->_vptr_RepeatedFieldAccessor[2])(this,data,(ulong)(uint)index,&local_30);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar1 = *(long *)CONCAT44(extraout_var,iVar2);
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar1,
             ((long *)CONCAT44(extraout_var,iVar2))[1] + lVar1);
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

T Get(const Field* data, int index) const {
    typedef typename RefTypeTraits<T>::AccessorValueType ActualType;
    ActualType scratch_space;
    return static_cast<T>(*reinterpret_cast<const ActualType*>(
        Get(data, index, static_cast<Value*>(&scratch_space))));
  }